

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O1

void wallscan(int x1,int x2,short *uwal,short *dwal,float *swal,fixed_t *lwal,double yrepeat,
             _func_BYTE_ptr_FTexture_ptr_int *getcol)

{
  float fVar1;
  short sVar2;
  short sVar3;
  double dVar4;
  uint uVar5;
  fixed_t fVar6;
  int iVar7;
  DWORD DVar8;
  int iVar9;
  ulong uVar10;
  BYTE *pBVar11;
  short *psVar12;
  byte bVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  float *pfVar17;
  int iVar18;
  long lVar19;
  float *pfVar20;
  uint uVar21;
  short *psVar22;
  bool bVar23;
  bool bVar24;
  float local_dc;
  long local_d8;
  int local_c8 [4];
  uint local_b8 [6];
  float *local_a0;
  fixed_t *local_98;
  fixed_t *local_90;
  int local_84;
  float *local_80;
  fixed_t *local_78;
  BYTE *local_70;
  short *local_68;
  short *local_60;
  short *local_58;
  _func_BYTE_ptr_FTexture_ptr_int *local_50;
  double local_48;
  ulong local_40;
  long local_38;
  
  if (rw_pic->UseType == '\r') {
    return;
  }
  local_dc = rw_light - rw_lightstep;
  local_50 = getcol;
  iVar14 = 0x20 - (uint)rw_pic->HeightBits;
  local_80 = swal;
  local_78 = lwal;
  local_68 = uwal;
  local_60 = dwal;
  local_48 = yrepeat;
  setupvline(iVar14);
  psVar22 = local_68;
  fVar6 = rw_offset;
  bVar23 = fixedcolormap != (lighttable_t *)0x0;
  bVar24 = -1 < fixedlightlev;
  local_70 = basecolormap->Maps;
  if (bVar24 || bVar23) {
    palookupoffse[0] = dc_colormap;
    palookupoffse[1] = dc_colormap;
    palookupoffse[2] = dc_colormap;
    palookupoffse[3] = dc_colormap;
  }
  local_84 = iVar14;
  local_40 = (ulong)(uint)x2;
  if ((x1 & 3U) == 0 || x2 <= x1) {
    uVar16 = (ulong)local_b8[0];
  }
  else {
    local_98 = (fixed_t *)(6755399441055744.0 / (double)(1 << ((byte)iVar14 & 0x1f)));
    lVar15 = (long)x1;
    psVar12 = local_60 + lVar15;
    local_90 = local_78 + lVar15;
    local_a0 = local_80 + lVar15;
    lVar19 = 0;
    local_58 = psVar12;
    do {
      local_dc = local_dc + rw_lightstep;
      sVar2 = psVar22[lVar15 + lVar19];
      uVar16 = (ulong)sVar2;
      iVar14 = (int)psVar12[lVar19];
      local_c8[0] = iVar14;
      if (sVar2 < psVar12[lVar19]) {
        iVar18 = (int)sVar2;
        local_b8[0] = (uint)sVar2;
        if (viewheight <= iVar18) {
          __assert_fail("y1ve[0] < viewheight",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                        ,0x468,
                        "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                       );
        }
        if (viewheight < iVar14) {
          __assert_fail("y2ve[0] <= viewheight",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                        ,0x469,
                        "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                       );
        }
        if (!bVar24 && !bVar23) {
          dVar4 = (double)local_dc;
          if (24.0 <= dVar4) {
            dVar4 = 24.0;
          }
          iVar7 = wallshade - SUB84(dVar4 + 103079215104.0,0) >> 0x10;
          if (0x1e < iVar7) {
            iVar7 = 0x1f;
          }
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          dc_colormap = local_70 + (uint)(iVar7 << 8);
        }
        dc_source = (*local_50)(rw_pic,local_90[lVar19] + fVar6 >> 0x10);
        dc_dest = dc_destorg + lVar19 + lVar15 + ylookup[uVar16];
        dc_count = iVar14 - iVar18;
        dc_iscale = SUB84((double)local_a0[lVar19] * local_48 + (double)local_98,0);
        dc_texturefrac =
             SUB84(dc_texturemid + (double)local_98 +
                   (((double)iVar18 + 0.5) - CenterY) * (double)local_a0[lVar19] * local_48,0);
        (*dovline1)();
        psVar12 = local_58;
      }
      uVar10 = lVar19 + lVar15 + 1;
      lVar19 = lVar19 + 1;
    } while (((long)uVar10 < (long)x2) && ((uVar10 & 3) != 0));
    x1 = x1 + (int)lVar19;
    x2 = (int)local_40;
  }
  local_b8[0] = (uint)uVar16;
  if (x1 < x2 + -3) {
    local_58 = (short *)(6755399441055744.0 / (double)(1 << ((byte)local_84 & 0x1f)));
    local_d8 = (long)x1;
    local_38 = (long)(x2 + -3);
    psVar22 = local_68 + local_d8;
    psVar12 = local_60 + local_d8;
    local_98 = local_78 + local_d8;
    pfVar17 = local_80 + local_d8;
    pfVar20 = (float *)(ulong)(uint)x1;
    do {
      lVar15 = 4;
      bVar13 = 0;
      local_a0 = pfVar20;
      do {
        sVar2 = psVar22[lVar15 + -1];
        iVar14 = (int)sVar2;
        local_c8[lVar15 + 3] = iVar14;
        sVar3 = psVar12[lVar15 + -1];
        local_c8[lVar15 + -1] = (int)sVar3;
        if (sVar2 < sVar3) {
          if (viewheight <= iVar14) {
            __assert_fail("y1ve[z] < viewheight",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                          ,0x482,
                          "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                         );
          }
          if (viewheight < sVar3) {
            __assert_fail("y2ve[z] <= viewheight",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                          ,0x483,
                          "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                         );
          }
          pBVar11 = (*local_50)(rw_pic,local_98[lVar15 + -1] + fVar6 >> 0x10);
          palookupoffse[lVar15 + 3] = pBVar11;
          fVar1 = pfVar17[lVar15 + -1];
          dVar4 = ((double)iVar14 + 0.5) - CenterY;
          vplce[lVar15 + 3] = SUB84((double)fVar1 * local_48 + (double)local_58,0);
          *(int *)(lVar15 * 4 + 0x88d08c) =
               SUB84(dc_texturemid + (double)local_58 + dVar4 * (double)fVar1 * local_48,0);
        }
        else {
          bVar13 = bVar13 + (char)(1 << ((char)lVar15 - 1U & 0x1f));
        }
        pfVar20 = local_a0;
        fVar1 = rw_lightstep;
        iVar14 = wallshade;
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
      if (bVar13 == 0xf) {
        local_dc = local_dc + rw_lightstep * 4.0;
      }
      else {
        if (!bVar24 && !bVar23) {
          lVar15 = 0;
          do {
            local_dc = local_dc + fVar1;
            dVar4 = (double)local_dc;
            if (24.0 <= dVar4) {
              dVar4 = 24.0;
            }
            iVar18 = iVar14 - SUB84(dVar4 + 103079215104.0,0) >> 0x10;
            if (0x1e < iVar18) {
              iVar18 = 0x1f;
            }
            if (iVar18 < 1) {
              iVar18 = 0;
            }
            palookupoffse[lVar15] = local_70 + (uint)(iVar18 << 8);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 4);
        }
        uVar5 = local_b8[1];
        if ((int)local_b8[1] < (int)local_b8[0]) {
          uVar5 = local_b8[0];
        }
        uVar21 = local_b8[3];
        if ((int)local_b8[3] < (int)local_b8[2]) {
          uVar21 = local_b8[2];
        }
        if ((int)uVar21 < (int)uVar5) {
          uVar21 = uVar5;
        }
        iVar14 = local_c8[1];
        if (local_c8[0] < local_c8[1]) {
          iVar14 = local_c8[0];
        }
        iVar18 = local_c8[3];
        if (local_c8[2] < local_c8[3]) {
          iVar18 = local_c8[2];
        }
        if (iVar14 < iVar18) {
          iVar18 = iVar14;
        }
        if ((bVar13 == 0) && ((int)uVar21 < iVar18)) {
          lVar15 = 0;
          local_90 = (fixed_t *)CONCAT44(local_90._4_4_,iVar18);
          do {
            iVar14 = local_c8[lVar15 + 4];
            if (iVar14 < (int)uVar21) {
              dc_count = uVar21 - iVar14;
              dc_iscale = vince[lVar15];
              dc_colormap = palookupoffse[lVar15];
              dc_texturefrac = vplce[lVar15];
              dc_source = bufplce[lVar15];
              dc_dest = dc_destorg + ((int)local_a0 + (int)lVar15 + ylookup[iVar14]);
              DVar8 = (*doprevline1)();
              vplce[lVar15] = DVar8;
              iVar18 = (int)local_90;
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != 4);
          if (iVar18 - uVar21 != 0 && (int)uVar21 <= iVar18) {
            dc_dest = dc_destorg + ylookup[(int)uVar21] + local_d8;
            dc_count = iVar18 - uVar21;
            vlinetallasm4();
            iVar18 = (int)local_90;
          }
          pBVar11 = dc_destorg;
          iVar14 = ylookup[iVar18];
          lVar15 = 0;
          do {
            iVar7 = local_c8[lVar15] - iVar18;
            if (iVar7 != 0 && iVar18 <= local_c8[lVar15]) {
              dc_iscale = vince[lVar15];
              dc_colormap = palookupoffse[0];
              dc_texturefrac = vplce[lVar15];
              dc_source = bufplce[lVar15];
              dc_dest = pBVar11 + lVar15 + iVar14 + local_d8;
              dc_count = iVar7;
              (*doprevline1)();
              iVar18 = (int)local_90;
            }
            lVar15 = lVar15 + 1;
            pfVar20 = local_a0;
          } while (lVar15 != 4);
        }
        else {
          lVar15 = 0;
          do {
            if ((bVar13 & 1) == 0) {
              dc_count = local_c8[lVar15] - local_c8[lVar15 + 4];
              dc_iscale = vince[lVar15];
              dc_colormap = palookupoffse[lVar15];
              dc_texturefrac = vplce[lVar15];
              dc_source = bufplce[lVar15];
              dc_dest = dc_destorg + ((int)pfVar20 + (int)lVar15 + ylookup[local_c8[lVar15 + 4]]);
              (*doprevline1)();
            }
            bVar13 = (char)bVar13 >> 1;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 4);
        }
      }
      local_d8 = local_d8 + 4;
      psVar22 = psVar22 + 4;
      psVar12 = psVar12 + 4;
      local_98 = local_98 + 4;
      pfVar17 = pfVar17 + 4;
      pfVar20 = pfVar20 + 1;
    } while (local_d8 < local_38);
    x1 = (int)local_d8;
    x2 = (int)local_40;
  }
  iVar14 = x2 - x1;
  if (iVar14 == 0 || x2 < x1) {
    uVar16 = (ulong)local_b8[0];
    iVar18 = local_c8[0];
  }
  else {
    local_98 = (fixed_t *)(6755399441055744.0 / (double)(1 << ((byte)local_84 & 0x1f)));
    lVar15 = (long)x1;
    do {
      local_dc = local_dc + rw_lightstep;
      sVar2 = local_68[lVar15];
      uVar16 = (ulong)sVar2;
      iVar18 = (int)local_60[lVar15];
      if (sVar2 < local_60[lVar15]) {
        iVar7 = (int)sVar2;
        if (viewheight <= iVar7) {
          local_c8[0] = iVar18;
          local_b8[0] = (int)sVar2;
          __assert_fail("y1ve[0] < viewheight",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                        ,0x4c7,
                        "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                       );
        }
        if (viewheight < iVar18) {
          local_c8[0] = iVar18;
          local_b8[0] = (int)sVar2;
          __assert_fail("y2ve[0] <= viewheight",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                        ,0x4c8,
                        "void wallscan(int, int, short *, short *, float *, fixed_t *, double, const BYTE *(*)(FTexture *, int))"
                       );
        }
        if (!bVar24 && !bVar23) {
          dVar4 = (double)local_dc;
          if (24.0 <= dVar4) {
            dVar4 = 24.0;
          }
          iVar9 = wallshade - SUB84(dVar4 + 103079215104.0,0) >> 0x10;
          if (0x1e < iVar9) {
            iVar9 = 0x1f;
          }
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          dc_colormap = local_70 + (uint)(iVar9 << 8);
        }
        dc_source = (*local_50)(rw_pic,local_78[lVar15] + fVar6 >> 0x10);
        dc_dest = dc_destorg + lVar15 + ylookup[uVar16];
        dc_count = iVar18 - iVar7;
        dc_iscale = SUB84((double)local_80[lVar15] * local_48 + (double)local_98,0);
        dc_texturefrac =
             SUB84(dc_texturemid + (double)local_98 +
                   (((double)iVar7 + 0.5) - CenterY) * (double)local_80[lVar15] * local_48,0);
        (*dovline1)();
      }
      lVar15 = lVar15 + 1;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
  }
  local_b8[0] = (uint)uVar16;
  local_c8[0] = iVar18;
  NetUpdate();
  return;
}

Assistant:

void wallscan (int x1, int x2, short *uwal, short *dwal, float *swal, fixed_t *lwal,
			   double yrepeat, const BYTE *(*getcol)(FTexture *tex, int x))
{
	int x, fracbits;
	int y1ve[4], y2ve[4], u4, d4, z;
	char bad;
	float light = rw_light - rw_lightstep;
	SDWORD xoffset;
	BYTE *basecolormapdata;
	double iscale;

	// This function also gets used to draw skies. Unlike BUILD, skies are
	// drawn by visplane instead of by bunch, so these checks are invalid.
	//if ((uwal[x1] > viewheight) && (uwal[x2] > viewheight)) return;
	//if ((dwal[x1] < 0) && (dwal[x2] < 0)) return;

	if (rw_pic->UseType == FTexture::TEX_Null)
	{
		return;
	}

//extern cycle_t WallScanCycles;
//clock (WallScanCycles);

	rw_pic->GetHeight();	// Make sure texture size is loaded
	fracbits = 32 - rw_pic->HeightBits;
	setupvline(fracbits);
	xoffset = rw_offset;
	basecolormapdata = basecolormap->Maps;

	x = x1;
	//while ((umost[x] > dmost[x]) && (x < x2)) x++;

	bool fixed = (fixedcolormap != NULL || fixedlightlev >= 0);
	if (fixed)
	{
		palookupoffse[0] = dc_colormap;
		palookupoffse[1] = dc_colormap;
		palookupoffse[2] = dc_colormap;
		palookupoffse[3] = dc_colormap;
	}

	for(; (x < x2) && (x & 3); ++x)
	{
		light += rw_lightstep;
		y1ve[0] = uwal[x];//max(uwal[x],umost[x]);
		y2ve[0] = dwal[x];//min(dwal[x],dmost[x]);
		if (y2ve[0] <= y1ve[0]) continue;
		assert (y1ve[0] < viewheight);
		assert (y2ve[0] <= viewheight);

		if (!fixed)
		{ // calculate lighting
			dc_colormap = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
		}

		dc_source = getcol (rw_pic, (lwal[x] + xoffset) >> FRACBITS);
		dc_dest = ylookup[y1ve[0]] + x + dc_destorg;
		dc_count = y2ve[0] - y1ve[0];
		iscale = swal[x] * yrepeat;
		dc_iscale = xs_ToFixed(fracbits, iscale);
		dc_texturefrac = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[0] - CenterY + 0.5));

		dovline1();
	}

	for(; x < x2-3; x += 4)
	{
		bad = 0;
		for (z = 3; z>= 0; --z)
		{
			y1ve[z] = uwal[x+z];//max(uwal[x+z],umost[x+z]);
			y2ve[z] = dwal[x+z];//min(dwal[x+z],dmost[x+z])-1;
			if (y2ve[z] <= y1ve[z]) { bad += 1<<z; continue; }
			assert (y1ve[z] < viewheight);
			assert (y2ve[z] <= viewheight);

			bufplce[z] = getcol (rw_pic, (lwal[x+z] + xoffset) >> FRACBITS);
			iscale = swal[x + z] * yrepeat;
			vince[z] = xs_ToFixed(fracbits, iscale);
			vplce[z] = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[z] - CenterY + 0.5));
		}
		if (bad == 15)
		{
			light += rw_lightstep * 4;
			continue;
		}

		if (!fixed)
		{
			for (z = 0; z < 4; ++z)
			{
				light += rw_lightstep;
				palookupoffse[z] = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
			}
		}

		u4 = MAX(MAX(y1ve[0],y1ve[1]),MAX(y1ve[2],y1ve[3]));
		d4 = MIN(MIN(y2ve[0],y2ve[1]),MIN(y2ve[2],y2ve[3]));

		if ((bad != 0) || (u4 >= d4))
		{
			for (z = 0; z < 4; ++z)
			{
				if (!(bad & 1))
				{
					prevline1(vince[z],palookupoffse[z],y2ve[z]-y1ve[z],vplce[z],bufplce[z],ylookup[y1ve[z]]+x+z+dc_destorg);
				}
				bad >>= 1;
			}
			continue;
		}

		for (z = 0; z < 4; ++z)
		{
			if (u4 > y1ve[z])
			{
				vplce[z] = prevline1(vince[z],palookupoffse[z],u4-y1ve[z],vplce[z],bufplce[z],ylookup[y1ve[z]]+x+z+dc_destorg);
			}
		}

		if (d4 > u4)
		{
			dc_count = d4-u4;
			dc_dest = ylookup[u4]+x+dc_destorg;
			dovline4();
		}

		BYTE *i = x+ylookup[d4]+dc_destorg;
		for (z = 0; z < 4; ++z)
		{
			if (y2ve[z] > d4)
			{
				prevline1(vince[z],palookupoffse[0],y2ve[z]-d4,vplce[z],bufplce[z],i+z);
			}
		}
	}
	for(;x<x2;x++)
	{
		light += rw_lightstep;
		y1ve[0] = uwal[x];//max(uwal[x],umost[x]);
		y2ve[0] = dwal[x];//min(dwal[x],dmost[x]);
		if (y2ve[0] <= y1ve[0]) continue;
		assert (y1ve[0] < viewheight);
		assert (y2ve[0] <= viewheight);

		if (!fixed)
		{ // calculate lighting
			dc_colormap = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
		}

		dc_source = getcol (rw_pic, (lwal[x] + xoffset) >> FRACBITS);
		dc_dest = ylookup[y1ve[0]] + x + dc_destorg;
		dc_count = y2ve[0] - y1ve[0];
		iscale = swal[x] * yrepeat;
		dc_iscale = xs_ToFixed(fracbits, iscale);
		dc_texturefrac = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[0] - CenterY + 0.5));

		dovline1();
	}

//unclock (WallScanCycles);

	NetUpdate ();
}